

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.pb.cc
# Opt level: O1

char * __thiscall bloaty::Regex::_InternalParse(Regex *this,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  byte bVar2;
  string *psVar3;
  bool bVar4;
  char cVar5;
  byte *pbVar6;
  char *field_name;
  uint32 uVar7;
  char *pcVar8;
  internal *this_00;
  StringPiece str;
  pair<const_char_*,_unsigned_int> pVar9;
  byte *local_50;
  ArenaStringPtr *local_48;
  ArenaStringPtr *local_40;
  InternalMetadataWithArena *local_38;
  char *size;
  
  local_40 = &this->replacement_;
  local_48 = &this->pattern_;
  local_38 = &this->_internal_metadata_;
  local_50 = (byte *)ptr;
  do {
    bVar4 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                      (&ctx->super_EpsCopyInputStream,(char **)&local_50,ctx->group_depth_);
    if (bVar4) {
      return (char *)local_50;
    }
    bVar1 = *local_50;
    pVar9.second._0_1_ = bVar1;
    pVar9.first = (char *)(local_50 + 1);
    pVar9._9_7_ = 0;
    if ((char)bVar1 < '\0') {
      bVar2 = local_50[1];
      uVar7 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
      if ((char)bVar2 < '\0') {
        pVar9 = google::protobuf::internal::ReadTagFallback((char *)local_50,uVar7);
      }
      else {
        pVar9.second = uVar7;
        pVar9.first = (char *)(local_50 + 2);
        pVar9._12_4_ = 0;
      }
    }
    local_50 = (byte *)pVar9.first;
    if (local_50 == (byte *)0x0) {
      cVar5 = '\x04';
    }
    else {
      uVar7 = pVar9.second;
      field_name = (char *)(pVar9._8_8_ >> 3 & 0x1fffffff);
      if ((int)field_name == 2) {
        if ((char)pVar9.second != '\x12') goto LAB_00181d9e;
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
        if ((this->replacement_).ptr_ ==
            (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
          google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                    (local_40,(string *)
                              &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
        }
        psVar3 = local_40->ptr_;
        pbVar6 = (byte *)google::protobuf::internal::InlineGreedyStringParser
                                   (psVar3,(char *)local_50,ctx);
        this_00 = (internal *)(psVar3->_M_dataplus)._M_p;
        size = (char *)psVar3->_M_string_length;
        if ((long)size < 0) {
          google::protobuf::StringPiece::LogFatalSizeTooBig((size_t)size,"size_t to int conversion")
          ;
        }
        pcVar8 = "bloaty.Regex.replacement";
      }
      else {
        if (((int)field_name != 1) || ((char)pVar9.second != '\n')) {
LAB_00181d9e:
          if (uVar7 == 0 || (uVar7 & 7) == 4) {
            (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar7 - 1;
            cVar5 = '\a';
          }
          else {
            local_50 = (byte *)google::protobuf::internal::UnknownFieldParse
                                         (uVar7,local_38,(char *)local_50,ctx);
            cVar5 = (local_50 == (byte *)0x0) * '\x02' + '\x02';
          }
          goto LAB_00181de6;
        }
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
        if ((this->pattern_).ptr_ ==
            (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
          google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                    (local_48,(string *)
                              &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
        }
        psVar3 = local_48->ptr_;
        pbVar6 = (byte *)google::protobuf::internal::InlineGreedyStringParser
                                   (psVar3,(char *)local_50,ctx);
        this_00 = (internal *)(psVar3->_M_dataplus)._M_p;
        size = (char *)psVar3->_M_string_length;
        if ((long)size < 0) {
          google::protobuf::StringPiece::LogFatalSizeTooBig((size_t)size,"size_t to int conversion")
          ;
        }
        pcVar8 = "bloaty.Regex.pattern";
      }
      str.length_ = (stringpiece_ssize_type)pcVar8;
      str.ptr_ = size;
      google::protobuf::internal::VerifyUTF8(this_00,str,field_name);
      cVar5 = (pbVar6 == (byte *)0x0) * '\x02' + '\x02';
      local_50 = pbVar6;
    }
LAB_00181de6:
    if (cVar5 != '\x02') {
      if (cVar5 == '\x04') {
        local_50 = (byte *)0x0;
      }
      return (char *)local_50;
    }
  } while( true );
}

Assistant:

const char* Regex::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional string pattern = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_pattern(), ptr, ctx, "bloaty.Regex.pattern");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string replacement = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_replacement(), ptr, ctx, "bloaty.Regex.replacement");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}